

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_NumExtensionsWithRepeatedFields_Test::
~ExtensionSetTest_NumExtensionsWithRepeatedFields_Test
          (ExtensionSetTest_NumExtensionsWithRepeatedFields_Test *this)

{
  ExtensionSetTest_NumExtensionsWithRepeatedFields_Test *this_local;
  
  ~ExtensionSetTest_NumExtensionsWithRepeatedFields_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtensionSetTest, NumExtensionsWithRepeatedFields) {
  unittest::TestAllExtensions msg;
  ExtensionSet set;
  const auto* desc =
      unittest::TestAllExtensions::descriptor()->file()->FindExtensionByName(
          "repeated_int32_extension");
  ASSERT_NE(desc, nullptr);
  set.MutableRawRepeatedField(desc->number(), WireFormatLite::TYPE_INT32, false,
                              desc);
  EXPECT_EQ(set.NumExtensions(), 1);
}